

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vreducess(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vreducess");
        (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vreducesd");
        (pMyDisasm->Reserved_).MemDecoration = 0xcc;
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vreducess(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vreducess");
        #endif
        GV.MemDecoration = Arg3dword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vreducesd");
        #endif
        GV.MemDecoration = Arg3qword;
      }
      GV.EVEX.tupletype = FULL;
      if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}